

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::ExactEdgeCircumcenterSign
              (Vector3_xf *x0,Vector3_xf *x1,Vector3_xf *a,Vector3_xf *b,Vector3_xf *c,int abc_sign)

{
  int32 iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int32 iVar8;
  int iVar9;
  ExactFloat rhs4;
  ExactFloat cab2;
  ExactFloat dab;
  ExactFloat bca2;
  ExactFloat dbc;
  ExactFloat abc2;
  ExactFloat dca;
  Vector3_xf nx;
  ExactFloat local_140;
  ExactFloat local_130;
  ExactFloat local_120;
  ExactFloat local_110;
  ExactFloat local_100;
  ExactFloat local_f0;
  Vector3<ExactFloat> local_e0;
  ExactFloat local_b0;
  ExactFloat local_a0;
  ExactFloat local_90;
  ExactFloat local_80;
  ExactFloat local_70;
  D local_60;
  
  bVar2 = ArePointsLinearlyDependent(x0,x1);
  if (bVar2) {
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_60,x0);
    ExactFloat::ExactFloat(local_e0.c_,0);
    bVar2 = operator<(local_e0.c_,local_60.c_);
    if (!bVar2) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                 ,0x36a,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_110.bn_.bn_,"Check failed: (x0.DotProd(x1)) > (0) ",0x25);
      abort();
    }
    BN_free((BIGNUM *)local_e0.c_[0].bn_.bn_);
    BN_free((BIGNUM *)local_60.c_[0].bn_.bn_);
    iVar6 = 0;
  }
  else {
    Vector3<ExactFloat>::CrossProd((Vector3<ExactFloat> *)&local_60,x0,x1);
    Vector3<ExactFloat>::CrossProd(&local_e0,a,b);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_110,&local_60);
    lVar7 = 0x30;
    do {
      BN_free(*(BIGNUM **)((long)local_e0.c_ + lVar7 + -8));
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
    Vector3<ExactFloat>::CrossProd(&local_e0,b,c);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_f0,&local_60);
    lVar7 = 0x30;
    do {
      BN_free(*(BIGNUM **)((long)local_e0.c_ + lVar7 + -8));
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
    Vector3<ExactFloat>::CrossProd(&local_e0,c,a);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b0,&local_60);
    lVar7 = 0x30;
    do {
      BN_free(*(BIGNUM **)((long)local_e0.c_ + lVar7 + -8));
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_100,a);
    operator*(&local_130,&local_f0);
    operator*(local_e0.c_,&local_100);
    BN_free((BIGNUM *)local_130.bn_.bn_);
    BN_free((BIGNUM *)local_100.bn_.bn_);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_130,b);
    operator*(&local_140,&local_b0);
    operator*(&local_100,&local_130);
    BN_free((BIGNUM *)local_140.bn_.bn_);
    BN_free((BIGNUM *)local_130.bn_.bn_);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_140,c);
    operator*(&local_120,&local_110);
    operator*(&local_130,&local_140);
    BN_free((BIGNUM *)local_120.bn_.bn_);
    BN_free((BIGNUM *)local_140.bn_.bn_);
    iVar4 = 0;
    if ((local_110.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
      iVar4 = local_110.sign_;
    }
    iVar3 = 0;
    if ((local_f0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
      iVar3 = local_f0.sign_;
    }
    iVar3 = iVar3 + iVar4;
    iVar6 = 1;
    if (iVar3 < 1) {
      iVar6 = iVar3;
    }
    iVar9 = -1;
    if (-1 < iVar6) {
      iVar9 = iVar6;
    }
    if ((iVar4 != 0) && (iVar3 == 0)) {
      operator-(&local_140,&local_130);
      iVar1 = local_140.bn_exp_;
      iVar8 = local_140.sign_;
      BN_free((BIGNUM *)local_140.bn_.bn_);
      if ((iVar1 & 0xfffffffdU) == 0x7ffffffd) {
        iVar8 = 0;
      }
      iVar9 = iVar8 * iVar4;
    }
    iVar4 = 0;
    if ((local_b0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
      iVar4 = local_b0.sign_;
    }
    iVar4 = iVar4 + iVar9;
    iVar3 = 1;
    if (iVar4 < 1) {
      iVar3 = iVar4;
    }
    iVar6 = -1;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    if ((iVar9 != 0) && (iVar4 == 0)) {
      iVar4 = 0;
      if ((local_110.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
        iVar4 = local_110.sign_;
      }
      iVar3 = 0;
      if ((local_f0.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
        iVar3 = local_f0.sign_;
      }
      operator-(&local_120,&local_100);
      operator-(&local_140,&local_120);
      BN_free((BIGNUM *)local_120.bn_.bn_);
      iVar3 = iVar3 * iVar4;
      iVar4 = 0;
      if ((local_140.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
        iVar4 = local_140.sign_;
      }
      iVar4 = iVar3 - iVar4;
      iVar5 = 1;
      if (iVar4 < 1) {
        iVar5 = iVar4;
      }
      iVar6 = -1;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar3 != 0 && iVar4 == 0) {
        ExactFloat::ExactFloat(&local_90,4);
        operator*(&local_80,&local_90);
        operator*(&local_70,&local_80);
        operator*(&local_a0,&local_140);
        operator-(&local_120,&local_70);
        iVar6 = 0;
        if ((local_120.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
          iVar6 = local_120.sign_;
        }
        BN_free((BIGNUM *)local_120.bn_.bn_);
        BN_free((BIGNUM *)local_a0.bn_.bn_);
        BN_free((BIGNUM *)local_70.bn_.bn_);
        BN_free((BIGNUM *)local_80.bn_.bn_);
        BN_free((BIGNUM *)local_90.bn_.bn_);
        iVar6 = iVar6 * iVar3;
      }
      BN_free((BIGNUM *)local_140.bn_.bn_);
      iVar6 = iVar6 * iVar9;
    }
    BN_free((BIGNUM *)local_130.bn_.bn_);
    BN_free((BIGNUM *)local_100.bn_.bn_);
    BN_free((BIGNUM *)local_e0.c_[0].bn_.bn_);
    BN_free((BIGNUM *)local_b0.bn_.bn_);
    BN_free((BIGNUM *)local_f0.bn_.bn_);
    BN_free((BIGNUM *)local_110.bn_.bn_);
    iVar6 = iVar6 * abc_sign;
    lVar7 = 0x30;
    do {
      BN_free(*(BIGNUM **)((long)local_60.c_ + lVar7 + -8));
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
  }
  return iVar6;
}

Assistant:

int ExactEdgeCircumcenterSign(const Vector3_xf& x0, const Vector3_xf& x1,
                              const Vector3_xf& a, const Vector3_xf& b,
                              const Vector3_xf& c, int abc_sign) {
  // Return zero if the edge X is degenerate.  (Also see the comments in
  // SymbolicEdgeCircumcenterSign.)
  if (ArePointsLinearlyDependent(x0, x1)) {
    S2_DCHECK_GT(x0.DotProd(x1), 0);  // Antipodal edges not allowed.
    return 0;
  }
  // The simplest predicate for testing whether the sign is positive is
  //
  // (1)  (X0 x X1) . (|C|(A x B) + |A|(B x C) + |B|(C x A)) > 0
  //
  // where |A| denotes A.Norm() and the expression after the "." represents
  // the circumcenter of triangle ABC.  (This predicate is terrible from a
  // numerical accuracy point of view, but that doesn't matter since we are
  // going to use exact arithmetic.)  This predicate also assumes that
  // triangle ABC is CCW (positive sign); we correct for that below.
  //
  // The only problem with evaluating this inequality is that computing |A|,
  // |B| and |C| requires square roots.  To avoid this problem we use the
  // standard technique of rearranging the inequality to isolate at least one
  // square root and then squaring both sides.  We need to repeat this process
  // twice in order to eliminate all the square roots, which leads to a
  // polynomial predicate of degree 20 in the input arguments.
  //
  // Rearranging (1) we get
  //
  //      (X0 x X1) . (|C|(A x B) + |A|(B x C)) > |B|(X0 x X1) . (A x C)
  //
  // Before squaring we need to check the sign of each side.  If the signs are
  // different then we know the result without squaring, and if the signs are
  // both negative then after squaring both sides we need to invert the
  // result.  Define
  //
  //      dAB = (X0 x X1) . (A x B)
  //      dBC = (X0 x X1) . (B x C)
  //      dCA = (X0 x X1) . (C x A)
  //
  // Then we can now write the inequality above as
  //
  // (2)  |C| dAB + |A| dBC > -|B| dCA
  //
  // The RHS of (2) is positive if dCA < 0, and the LHS of (2) is positive if
  // (|C| dAB + |A| dBC) > 0.  Since the LHS has square roots, we need to
  // eliminate them using the same process.  Rewriting the LHS as
  //
  // (3)  |C| dAB > -|A| dBC
  //
  // we again need to check the signs of both sides.  Let's start with that.
  // We also precompute the following values because they are used repeatedly
  // when squaring various expressions below:
  //
  //     abc2 = |A|^2 dBC^2
  //     bca2 = |B|^2 dCA^2
  //     cab2 = |C|^2 dAB^2
  Vector3_xf nx = x0.CrossProd(x1);
  ExactFloat dab = nx.DotProd(a.CrossProd(b));
  ExactFloat dbc = nx.DotProd(b.CrossProd(c));
  ExactFloat dca = nx.DotProd(c.CrossProd(a));
  ExactFloat abc2 = a.Norm2() * (dbc * dbc);
  ExactFloat bca2 = b.Norm2() * (dca * dca);
  ExactFloat cab2 = c.Norm2() * (dab * dab);

  // If the two sides of (3) have different signs (including the case where
  // one side is zero) then we know the result.  Also, if both sides are zero
  // then we know the result.  The following logic encodes this.
  int lhs3_sgn = dab.sgn(), rhs3_sgn = -dbc.sgn();
  int lhs2_sgn = max(-1, min(1, lhs3_sgn - rhs3_sgn));
  if (lhs2_sgn == 0 && lhs3_sgn != 0) {
    // Both sides of (3) have the same non-zero sign, so square both sides.
    // If both sides were negative then invert the result.
    lhs2_sgn = (cab2 - abc2).sgn() * lhs3_sgn;
  }
  // Now if the two sides of (2) have different signs then we know the result
  // of this entire function.
  int rhs2_sgn = -dca.sgn();
  int result = max(-1, min(1, lhs2_sgn - rhs2_sgn));
  if (result == 0 && lhs2_sgn != 0) {
    // Both sides of (2) have the same non-zero sign, so square both sides.
    // (If both sides were negative then we invert the result below.)
    // This gives
    //
    //        |C|^2 dAB^2 + |A|^2 dBC^2 + 2 |A| |C| dAB dBC > |B|^2 dCA^2
    //
    // This expression still has square roots (|A| and |C|), so we rewrite as
    //
    // (4)    2 |A| |C| dAB dBC > |B|^2 dCA^2 - |C|^2 dAB^2 - |A|^2 dBC^2 .
    //
    // Again, if the two sides have different signs then we know the result.
    int lhs4_sgn = dab.sgn() * dbc.sgn();
    ExactFloat rhs4 = bca2 - cab2 - abc2;
    result = max(-1, min(1, lhs4_sgn - rhs4.sgn()));
    if (result == 0 && lhs4_sgn != 0) {
      // Both sides of (4) have the same non-zero sign, so square both sides.
      // If both sides were negative then invert the result.
      result = (4 * abc2 * cab2 - rhs4 * rhs4).sgn() * lhs4_sgn;
    }
    // Correct the sign if both sides of (2) were negative.
    result *= lhs2_sgn;
  }
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  return abc_sign * result;
}